

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_channel_conversion_path
ma_channel_map_get_conversion_path
          (ma_channel *pChannelMapIn,ma_uint32 channelsIn,ma_channel *pChannelMapOut,
          ma_uint32 channelsOut,ma_channel_mix_mode mode)

{
  bool bVar1;
  ma_bool32 mVar2;
  uint in_ECX;
  char *in_RDX;
  uint in_ESI;
  char *in_RDI;
  int in_R8D;
  ma_bool32 isInputChannelPositionInOutput;
  ma_bool32 areAllChannelPositionsPresent;
  ma_uint32 iChannelIn;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar3;
  undefined8 in_stack_ffffffffffffffc0;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint local_2c;
  ma_channel_conversion_path local_4;
  
  mVar2 = ma_channel_map_is_passthrough
                    ((ma_channel *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (ma_uint32)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                     (ma_channel *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
  if (mVar2 == 0) {
    if ((in_ECX == 1) && ((in_RDX == (char *)0x0 || (*in_RDX == '\x01')))) {
      local_4 = ma_channel_conversion_path_mono_out;
    }
    else if ((in_ESI == 1) && ((in_RDI == (char *)0x0 || (*in_RDI == '\x01')))) {
      local_4 = ma_channel_conversion_path_mono_in;
    }
    else if (in_R8D == 2) {
      local_4 = ma_channel_conversion_path_weights;
    }
    else {
      if (in_ESI == in_ECX) {
        bVar1 = true;
        for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
          uVar3 = in_ECX;
          pcVar4 = in_RDX;
          ma_channel_map_get_channel
                    ((ma_channel *)CONCAT44(in_ECX,in_stack_ffffffffffffffb8),0,0x20ff16);
          mVar2 = ma_channel_map_contains_channel_position
                            ((ma_uint32)((ulong)pcVar4 >> 0x20),
                             (ma_channel *)CONCAT44(uVar3,in_stack_ffffffffffffffb8),'\0');
          if (mVar2 == 0) {
            bVar1 = false;
            break;
          }
        }
        if (bVar1) {
          return ma_channel_conversion_path_shuffle;
        }
      }
      local_4 = ma_channel_conversion_path_weights;
    }
  }
  else {
    local_4 = ma_channel_conversion_path_passthrough;
  }
  return local_4;
}

Assistant:

static ma_channel_conversion_path ma_channel_map_get_conversion_path(const ma_channel* pChannelMapIn, ma_uint32 channelsIn, const ma_channel* pChannelMapOut, ma_uint32 channelsOut, ma_channel_mix_mode mode)
{
    if (ma_channel_map_is_passthrough(pChannelMapIn, channelsIn, pChannelMapOut, channelsOut)) {
        return ma_channel_conversion_path_passthrough;
    }

    if (channelsOut == 1 && (pChannelMapOut == NULL || pChannelMapOut[0] == MA_CHANNEL_MONO)) {
        return ma_channel_conversion_path_mono_out;
    }

    if (channelsIn == 1 && (pChannelMapIn == NULL || pChannelMapIn[0] == MA_CHANNEL_MONO)) {
        return ma_channel_conversion_path_mono_in;
    }

    if (mode == ma_channel_mix_mode_custom_weights) {
        return ma_channel_conversion_path_weights;
    }

    /*
    We can use a simple shuffle if both channel maps have the same channel count and all channel
    positions are present in both.
    */
    if (channelsIn == channelsOut) {
        ma_uint32 iChannelIn;
        ma_bool32 areAllChannelPositionsPresent = MA_TRUE;
        for (iChannelIn = 0; iChannelIn < channelsIn; ++iChannelIn) {
            ma_bool32 isInputChannelPositionInOutput = ma_channel_map_contains_channel_position(channelsOut, pChannelMapOut, ma_channel_map_get_channel(pChannelMapIn, channelsIn, iChannelIn));
            if (!isInputChannelPositionInOutput) {
                areAllChannelPositionsPresent = MA_FALSE;
                break;
            }
        }

        if (areAllChannelPositionsPresent) {
            return ma_channel_conversion_path_shuffle;
        }
    }

    /* Getting here means we'll need to use weights. */
    return ma_channel_conversion_path_weights;
}